

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O0

XmlNodePtr __thiscall libcellml::XmlDoc::rootNode(XmlDoc *this)

{
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 *in_RSI;
  XmlNodePtr XVar2;
  shared_ptr<libcellml::XmlNode> local_38;
  undefined1 local_21;
  xmlNodePtr local_20;
  xmlNodePtr root;
  XmlDoc *this_local;
  XmlNodePtr *rootHandle;
  
  this_local = this;
  local_20 = (xmlNodePtr)xmlDocGetRootElement(*(undefined8 *)*in_RSI);
  local_21 = 0;
  std::shared_ptr<libcellml::XmlNode>::shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)this,(nullptr_t)0x0);
  _Var1._M_pi = extraout_RDX;
  if (local_20 != (xmlNodePtr)0x0) {
    std::make_shared<libcellml::XmlNode>();
    std::shared_ptr<libcellml::XmlNode>::operator=((shared_ptr<libcellml::XmlNode> *)this,&local_38)
    ;
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_38);
    this_00 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    XmlNode::setXmlNode(this_00,&local_20);
    _Var1._M_pi = extraout_RDX_00;
  }
  XVar2.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  XVar2.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (XmlNodePtr)XVar2.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr XmlDoc::rootNode() const
{
    xmlNodePtr root = xmlDocGetRootElement(mPimpl->mXmlDocPtr);
    XmlNodePtr rootHandle = nullptr;
    if (root != nullptr) {
        rootHandle = std::make_shared<XmlNode>();
        rootHandle->setXmlNode(root);
    }
    return rootHandle;
}